

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.c
# Opt level: O0

void class6(int *ip)

{
  char last_char;
  int iVar1;
  uint local_20 [2];
  int addr [3];
  int i;
  int *ip_local;
  
  loccnt = loccnt + 7;
  addr[1] = 0;
  unique0x100000d4 = ip;
  while( true ) {
    if (2 < addr[1]) {
      if (pass == 1) {
        putbyte(data_loccnt,opval);
        putword(data_loccnt + 1,local_20[0]);
        putword(data_loccnt + 3,local_20[1]);
        putword(data_loccnt + 5,addr[0]);
        println();
      }
      return;
    }
    last_char = ';';
    if (addr[1] < 2) {
      last_char = ',';
    }
    iVar1 = evaluate(stack0xfffffffffffffff0,last_char);
    if (iVar1 == 0) break;
    if ((pass == 1) && ((value & 0xffff0000) != 0)) {
      error("Operand size error!");
      return;
    }
    local_20[addr[1]] = value;
    addr[1] = addr[1] + 1;
  }
  return;
}

Assistant:

void
class6(int *ip)
{
	int	i;
	int addr[3];

	/* update location counter */
	loccnt +=7;

	/* get operands */
    for (i = 0; i < 3; i++) {
		if (!evaluate(ip, (i < 2) ? ',' : ';'))
			return;
		if (pass == LAST_PASS) {
			if (value & 0xFFFF0000) {
				error("Operand size error!");
				return;
			}
		}
	    addr[i] = value;
	}

	/* generate code */
	if (pass == LAST_PASS) {
		/* opcodes */
		putbyte(data_loccnt, opval);
		putword(data_loccnt+1, addr[0]);
		putword(data_loccnt+3, addr[1]);
		putword(data_loccnt+5, addr[2]);

		/* output line */
		println();
	}
}